

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O0

Duration * __thiscall absl::Duration::operator-=(Duration *this,Duration rhs)

{
  long lVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  bool bVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  int64_t iVar7;
  long v;
  Duration DVar8;
  Duration d;
  Duration d_00;
  Duration d_01;
  int64_t local_b0;
  uint32_t local_a8;
  int64_t orig_rep_hi;
  int64_t local_58;
  uint32_t local_50;
  Duration *this_local;
  Duration rhs_local;
  
  v = rhs.rep_hi_;
  uVar2 = this->rep_hi_;
  uVar3 = this->rep_lo_;
  DVar8.rep_lo_ = uVar3;
  DVar8.rep_hi_ = uVar2;
  DVar8._12_4_ = 0;
  bVar4 = time_internal::IsInfiniteDuration(DVar8);
  if (!bVar4) {
    d._12_4_ = 0;
    d.rep_hi_ = SUB128(rhs._0_12_,0);
    d.rep_lo_ = SUB124(rhs._0_12_,8);
    bVar4 = time_internal::IsInfiniteDuration(d);
    if (bVar4) {
      if (v < 0) {
        DVar8 = InfiniteDuration();
        local_58 = DVar8.rep_hi_;
        local_50 = DVar8.rep_lo_;
      }
      else {
        DVar8 = InfiniteDuration();
        d_00._12_4_ = 0;
        d_00.rep_hi_ = SUB128(DVar8._0_12_,0);
        d_00.rep_lo_ = SUB124(DVar8._0_12_,8);
        DVar8 = absl::operator-(d_00);
        local_58 = DVar8.rep_hi_;
        local_50 = DVar8.rep_lo_;
      }
      this->rep_hi_ = local_58;
      this->rep_lo_ = local_50;
    }
    else {
      lVar1 = this->rep_hi_;
      uVar5 = anon_unknown_0::EncodeTwosComp(this->rep_hi_);
      uVar6 = anon_unknown_0::EncodeTwosComp(v);
      iVar7 = anon_unknown_0::DecodeTwosComp(uVar5 - uVar6);
      this->rep_hi_ = iVar7;
      if (this->rep_lo_ < rhs.rep_lo_) {
        uVar5 = anon_unknown_0::EncodeTwosComp(this->rep_hi_);
        iVar7 = anon_unknown_0::DecodeTwosComp(uVar5 - 1);
        this->rep_hi_ = iVar7;
        this->rep_lo_ = this->rep_lo_ + 4000000000;
      }
      this->rep_lo_ = this->rep_lo_ - rhs.rep_lo_;
      if (v < 0) {
        if (lVar1 <= this->rep_hi_) {
          return this;
        }
      }
      else if (this->rep_hi_ <= lVar1) {
        return this;
      }
      if (v < 0) {
        DVar8 = InfiniteDuration();
        local_b0 = DVar8.rep_hi_;
        local_a8 = DVar8.rep_lo_;
      }
      else {
        DVar8 = InfiniteDuration();
        d_01._12_4_ = 0;
        d_01.rep_hi_ = SUB128(DVar8._0_12_,0);
        d_01.rep_lo_ = SUB124(DVar8._0_12_,8);
        DVar8 = absl::operator-(d_01);
        local_b0 = DVar8.rep_hi_;
        local_a8 = DVar8.rep_lo_;
      }
      this->rep_hi_ = local_b0;
      this->rep_lo_ = local_a8;
    }
  }
  return this;
}

Assistant:

Duration& Duration::operator-=(Duration rhs) {
  if (time_internal::IsInfiniteDuration(*this)) return *this;
  if (time_internal::IsInfiniteDuration(rhs)) {
    return *this = rhs.rep_hi_ >= 0 ? -InfiniteDuration() : InfiniteDuration();
  }
  const int64_t orig_rep_hi = rep_hi_;
  rep_hi_ =
      DecodeTwosComp(EncodeTwosComp(rep_hi_) - EncodeTwosComp(rhs.rep_hi_));
  if (rep_lo_ < rhs.rep_lo_) {
    rep_hi_ = DecodeTwosComp(EncodeTwosComp(rep_hi_) - 1);
    rep_lo_ += kTicksPerSecond;
  }
  rep_lo_ -= rhs.rep_lo_;
  if (rhs.rep_hi_ < 0 ? rep_hi_ < orig_rep_hi : rep_hi_ > orig_rep_hi) {
    return *this = rhs.rep_hi_ >= 0 ? -InfiniteDuration() : InfiniteDuration();
  }
  return *this;
}